

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O0

bool __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_Connect
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this,IPort *pPort,gcstring *PortName)

{
  byte bVar1;
  ExceptionReporter<GenICam_3_4::AccessException> *this_00;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  int in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  ExceptionReporter<GenICam_3_4::AccessException> *in_stack_ffffffffffffff40;
  
  if (*(long *)(in_RDI + 8) != 0) {
    bVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),in_RSI,in_RDX);
    return (bool)(bVar1 & 1);
  }
  this_00 = (ExceptionReporter<GenICam_3_4::AccessException> *)__cxa_allocate_exception(0x1f0);
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::ExceptionReporter
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_RDI);
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::Report
            (this_00,&stack0xffffffffffffff40,"Feature not present (reference not valid)");
  __cxa_throw(this_00,&GenICam_3_4::AccessException::typeinfo,
              GenICam_3_4::AccessException::~AccessException);
}

Assistant:

inline bool CNodeMapRefT<TCameraParams>::_Connect(IPort* pPort, const GENICAM_NAMESPACE::gcstring& PortName) const
    {
        if(_Ptr)
            return _Ptr->Connect(pPort, PortName);
        throw ACCESS_EXCEPTION("Feature not present (reference not valid)");
    }